

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult
testing::internal::CmpHelperSTRNE(char *s1_expression,char *s2_expression,wchar_t *s1,wchar_t *s2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  wchar_t *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  wchar_t **value;
  wchar_t **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  AssertionResult *in_RDI;
  wchar_t *in_R8;
  AssertionResult AVar4;
  testing local_88 [8];
  testing local_80 [8];
  char *local_78;
  char *local_70;
  string local_68;
  string local_48;
  AssertionResult local_28;
  
  bVar1 = String::WideCStringEquals(in_RCX,in_R8);
  if (bVar1) {
    local_28.success_ = false;
    local_28.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar2 = AssertionResult::operator<<(&local_28,(char (*) [12])"Expected: (");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_78);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"), actual: ");
    PrintToString<wchar_t_const*>(&local_48,local_80,value);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
    PrintToString<wchar_t_const*>(&local_68,local_88,value_00);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_68);
    AssertionResult::AssertionResult(in_RDI,pAVar2);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_28.message_);
    sVar3.ptr_ = extraout_RDX_00;
  }
  else {
    in_RDI->success_ = true;
    (in_RDI->message_).ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = in_RDI;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperSTRNE(const char* s1_expression,
                               const char* s2_expression,
                               const wchar_t* s1,
                               const wchar_t* s2) {
  if (!String::WideCStringEquals(s1, s2)) {
    return AssertionSuccess();
  }

  return AssertionFailure() << "Expected: (" << s1_expression << ") != ("
                            << s2_expression << "), actual: "
                            << PrintToString(s1)
                            << " vs " << PrintToString(s2);
}